

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_util.hpp
# Opt level: O0

bool units::detail::times_overflows(unit_data *a,unit_data *b)

{
  bool bVar1;
  undefined1 local_19;
  unit_data *b_local;
  unit_data *a_local;
  
  bVar1 = base_access<0>::plus_overflows<units::detail::unit_data>(a,b);
  local_19 = true;
  if (!bVar1) {
    bVar1 = base_access<1>::plus_overflows<units::detail::unit_data>(a,b);
    local_19 = true;
    if (!bVar1) {
      bVar1 = base_access<2>::plus_overflows<units::detail::unit_data>(a,b);
      local_19 = true;
      if (!bVar1) {
        bVar1 = base_access<3>::plus_overflows<units::detail::unit_data>(a,b);
        local_19 = true;
        if (!bVar1) {
          bVar1 = base_access<4>::plus_overflows<units::detail::unit_data>(a,b);
          local_19 = true;
          if (!bVar1) {
            bVar1 = base_access<5>::plus_overflows<units::detail::unit_data>(a,b);
            local_19 = true;
            if (!bVar1) {
              bVar1 = base_access<6>::plus_overflows<units::detail::unit_data>(a,b);
              local_19 = true;
              if (!bVar1) {
                bVar1 = base_access<7>::plus_overflows<units::detail::unit_data>(a,b);
                local_19 = true;
                if (!bVar1) {
                  bVar1 = base_access<8>::plus_overflows<units::detail::unit_data>(a,b);
                  local_19 = true;
                  if (!bVar1) {
                    local_19 = base_access<9>::plus_overflows<units::detail::unit_data>(a,b);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

constexpr bool times_overflows(const unit_data& a, const unit_data& b)
    {
        return (
            base_access<0>::plus_overflows(a, b) ||
            base_access<1>::plus_overflows(a, b) ||
            base_access<2>::plus_overflows(a, b) ||
            base_access<3>::plus_overflows(a, b) ||
            base_access<4>::plus_overflows(a, b) ||
            base_access<5>::plus_overflows(a, b) ||
            base_access<6>::plus_overflows(a, b) ||
            base_access<7>::plus_overflows(a, b) ||
            base_access<8>::plus_overflows(a, b) ||
            base_access<9>::plus_overflows(a, b));
    }